

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O2

void jpeg_fdct_14x14(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  JSAMPROW pJVar15;
  ulong uVar16;
  long lVar17;
  int *piVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  DCTELEM workspace [48];
  int *local_160;
  int local_f8 [8];
  int aiStack_d8 [8];
  int aiStack_b8 [8];
  int aiStack_98 [8];
  int aiStack_78 [8];
  int aiStack_58 [10];
  
  uVar16 = (ulong)start_col;
  lVar20 = 0;
  local_160 = data;
  do {
    pJVar15 = sample_data[lVar20];
    uVar24 = (ulong)((uint)pJVar15[uVar16] + (uint)pJVar15[uVar16 + 0xd]);
    uVar33 = (ulong)((uint)pJVar15[uVar16 + 1] + (uint)pJVar15[uVar16 + 0xc]);
    uVar21 = (ulong)((uint)pJVar15[uVar16 + 5] + (uint)pJVar15[uVar16 + 8]);
    uVar26 = (ulong)((uint)pJVar15[uVar16 + 6] + (uint)pJVar15[uVar16 + 7]);
    lVar19 = uVar26 + uVar24;
    lVar25 = uVar24 - uVar26;
    lVar22 = uVar21 + uVar33;
    lVar34 = uVar33 - uVar21;
    uVar24 = (ulong)((uint)pJVar15[uVar16 + 2] + (uint)pJVar15[uVar16 + 0xb]);
    uVar21 = (ulong)((uint)pJVar15[uVar16 + 4] + (uint)pJVar15[uVar16 + 9]);
    lVar29 = uVar21 + uVar24;
    lVar30 = uVar24 - uVar21;
    lVar35 = (ulong)pJVar15[uVar16] - (ulong)pJVar15[uVar16 + 0xd];
    lVar23 = (ulong)pJVar15[uVar16 + 1] - (ulong)pJVar15[uVar16 + 0xc];
    lVar27 = (ulong)pJVar15[uVar16 + 2] - (ulong)pJVar15[uVar16 + 0xb];
    iVar36 = (uint)pJVar15[uVar16 + 3] + (uint)pJVar15[uVar16 + 10];
    lVar31 = (ulong)pJVar15[uVar16 + 3] - (ulong)pJVar15[uVar16 + 10];
    lVar28 = (ulong)pJVar15[uVar16 + 4] - (ulong)pJVar15[uVar16 + 9];
    lVar32 = (ulong)pJVar15[uVar16 + 5] - (ulong)pJVar15[uVar16 + 8];
    lVar17 = (ulong)pJVar15[uVar16 + 6] - (ulong)pJVar15[uVar16 + 7];
    *local_160 = (int)lVar29 + (int)lVar22 + (int)lVar19 + iVar36 + -0x700;
    local_160[4] = (int)(lVar19 * 0x28c6 + (ulong)(uint)(iVar36 * 2) * -0x2000000016a1 + 0x1000 +
                         lVar29 * 0x1fffffffe3c9 + lVar22 * 0xa12 >> 0xd);
    lVar19 = (lVar34 + lVar25) * 0x2362;
    local_160[2] = (int)((ulong)(lVar30 * 0x13a3 + lVar19 + 0x1000 + lVar25 * 0x8bd) >> 0xd);
    local_160[6] = (int)((ulong)(lVar19 + lVar30 * 0x1fffffffd3e1 + 0x1000 + lVar34 * 0x1fffffffc8fc
                                ) >> 0xd);
    local_160[7] = ((int)lVar35 + (int)lVar31) -
                   ((int)(lVar27 + lVar23) + (int)(lVar32 - lVar28) + (int)lVar17);
    lVar19 = (lVar32 - lVar28) * 0x2cf8 + lVar31 * -0x2000 + (lVar27 + lVar23) * -0x511;
    lVar22 = (lVar17 + lVar28) * 0x1814 + (lVar27 + lVar35) * 0x2652;
    local_160[5] = (int)((ulong)(lVar28 * 0x23d7 + lVar22 +
                                lVar27 * 0x1fffffffb409 + lVar19 + 0x1000) >> 0xd);
    lVar29 = (lVar32 - lVar17) * 0xef2 + (lVar23 + lVar35) * 0x2ab7;
    local_160[3] = (int)((ulong)(lVar32 * 0x1fffffff9dc4 + lVar29 +
                                lVar19 + lVar23 * 0x1ffffffff26e + 0x1000) >> 0xd);
    local_160[1] = (int)((ulong)(lVar22 + 0x1000 +
                                lVar31 * 0x2000 + lVar17 * 0x1fffffffdbf1 + lVar35 * 0x1fffffffdbf0
                                + lVar29) >> 0xd);
    piVar18 = local_f8;
    if ((int)lVar20 != 7) {
      if ((int)lVar20 == 0xd) {
        lVar20 = 0;
        for (iVar36 = 7; -1 < iVar36; iVar36 = iVar36 + -1) {
          iVar1 = *(int *)((long)aiStack_58 + lVar20);
          iVar2 = *(int *)((long)data + lVar20);
          iVar3 = *(int *)((long)data + lVar20 + 0x20);
          lVar27 = (long)(iVar1 + iVar2);
          iVar4 = *(int *)((long)aiStack_78 + lVar20);
          lVar30 = (long)(iVar4 + iVar3);
          iVar5 = *(int *)((long)data + lVar20 + 0x40);
          iVar6 = *(int *)((long)aiStack_98 + lVar20);
          iVar7 = *(int *)((long)local_f8 + lVar20);
          iVar8 = *(int *)((long)data + lVar20 + 0xa0);
          lVar29 = (long)(iVar7 + iVar8);
          iVar9 = *(int *)((long)data + lVar20 + 0xc0);
          iVar10 = *(int *)((long)data + lVar20 + 0xe0);
          lVar22 = (long)(iVar9 + iVar10);
          lVar19 = lVar22 + lVar27;
          lVar27 = lVar27 - lVar22;
          lVar22 = lVar29 + lVar30;
          lVar30 = lVar30 - lVar29;
          lVar28 = (long)(iVar6 + iVar5);
          iVar11 = *(int *)((long)data + lVar20 + 0x80);
          iVar12 = *(int *)((long)aiStack_d8 + lVar20);
          lVar17 = (long)(iVar12 + iVar11);
          lVar29 = lVar17 + lVar28;
          lVar28 = lVar28 - lVar17;
          iVar13 = *(int *)((long)data + lVar20 + 0x60);
          iVar14 = *(int *)((long)aiStack_b8 + lVar20);
          lVar17 = (long)(iVar14 + iVar13);
          *(int *)((long)data + lVar20) =
               (int)((lVar22 + lVar19 + lVar29 + lVar17) * 0x14e6 + 0x2000U >> 0xe);
          *(int *)((long)data + lVar20 + 0x80) =
               (int)((ulong)(lVar19 * 0x1aa1 + lVar17 * -0x800000001d90 + 0x2000 +
                            lVar29 * 0x3fffffffed93 + lVar22 * 0x694) >> 0xe);
          lVar17 = (lVar27 + lVar30) * 0x171b;
          lVar23 = (long)(iVar2 - iVar1);
          lVar31 = (long)(iVar3 - iVar4);
          lVar19 = (long)(iVar5 - iVar6);
          lVar29 = (long)(iVar13 - iVar14);
          lVar32 = (long)(iVar11 - iVar12);
          lVar25 = (long)(iVar8 - iVar7);
          lVar22 = (long)(iVar9 - iVar10);
          *(int *)((long)data + lVar20 + 0x40) =
               (int)((ulong)(lVar17 + lVar28 * 0xcd3 + 0x2000 + lVar27 * 0x5b5) >> 0xe);
          *(int *)((long)data + lVar20 + 0xc0) =
               (int)((ulong)(lVar17 + lVar28 * 0x3fffffffe330 + 0x2000 + lVar30 * 0x3fffffffdc12) >>
                    0xe);
          *(int *)((long)data + lVar20 + 0xe0) =
               (int)(((lVar23 + lVar29) - (lVar19 + lVar31 + (lVar25 - lVar32) + lVar22)) * 0x14e6 +
                     0x2000U >> 0xe);
          lVar27 = (lVar25 - lVar32) * 0x1d5e + lVar29 * -0x14e6 + (lVar19 + lVar31) * -0x34f;
          lVar17 = (lVar22 + lVar32) * 0xfb9 + (lVar19 + lVar23) * 0x1906;
          *(int *)((long)data + lVar20 + 0xa0) =
               (int)((ulong)(lVar32 * 0x1768 + lVar17 + lVar19 * 0x3fffffffce64 + lVar27 + 0x2000)
                    >> 0xe);
          lVar19 = (lVar25 - lVar22) * 0x9c3 + (lVar23 + lVar31) * 0x1be5;
          *(int *)((long)data + lVar20 + 0x60) =
               (int)((ulong)(lVar25 * 0x3fffffffbfd9 + lVar19 +
                            lVar27 + lVar31 * 0x3ffffffff723 + 0x2000) >> 0xe);
          *(int *)((long)data + lVar20 + 0x20) =
               (int)((ulong)(lVar17 + 0x2000 +
                            lVar23 * 0x3fffffffe873 + lVar29 * 0x14e6 + lVar22 * 0x3ffffffffd59 +
                            lVar19) >> 0xe);
          lVar20 = lVar20 + 4;
        }
        return;
      }
      piVar18 = local_160 + 8;
    }
    lVar20 = lVar20 + 1;
    local_160 = piVar18;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_fdct_14x14 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15, tmp16;
  DCTELEM workspace[8*6];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT. */
  /* cK represents sqrt(2) * cos(K*pi/28). */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[13]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[12]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[11]);
    tmp13 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[10]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[9]);
    tmp5 = GETJSAMPLE(elemptr[5]) + GETJSAMPLE(elemptr[8]);
    tmp6 = GETJSAMPLE(elemptr[6]) + GETJSAMPLE(elemptr[7]);

    tmp10 = tmp0 + tmp6;
    tmp14 = tmp0 - tmp6;
    tmp11 = tmp1 + tmp5;
    tmp15 = tmp1 - tmp5;
    tmp12 = tmp2 + tmp4;
    tmp16 = tmp2 - tmp4;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[13]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[12]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[11]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[10]);
    tmp4 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[9]);
    tmp5 = GETJSAMPLE(elemptr[5]) - GETJSAMPLE(elemptr[8]);
    tmp6 = GETJSAMPLE(elemptr[6]) - GETJSAMPLE(elemptr[7]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      (tmp10 + tmp11 + tmp12 + tmp13 - 14 * CENTERJSAMPLE);
    tmp13 += tmp13;
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp13, FIX(1.274162392)) + /* c4 */
	      MULTIPLY(tmp11 - tmp13, FIX(0.314692123)) - /* c12 */
	      MULTIPLY(tmp12 - tmp13, FIX(0.881747734)),  /* c8 */
	      CONST_BITS);

    tmp10 = MULTIPLY(tmp14 + tmp15, FIX(1.105676686));    /* c6 */

    dataptr[2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp14, FIX(0.273079590))   /* c2-c6 */
	      + MULTIPLY(tmp16, FIX(0.613604268)),        /* c10 */
	      CONST_BITS);
    dataptr[6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp15, FIX(1.719280954))   /* c6+c10 */
	      - MULTIPLY(tmp16, FIX(1.378756276)),        /* c2 */
	      CONST_BITS);

    /* Odd part */

    tmp10 = tmp1 + tmp2;
    tmp11 = tmp5 - tmp4;
    dataptr[7] = (DCTELEM) (tmp0 - tmp10 + tmp3 - tmp11 - tmp6);
    tmp3 <<= CONST_BITS;
    tmp10 = MULTIPLY(tmp10, - FIX(0.158341681));          /* -c13 */
    tmp11 = MULTIPLY(tmp11, FIX(1.405321284));            /* c1 */
    tmp10 += tmp11 - tmp3;
    tmp11 = MULTIPLY(tmp0 + tmp2, FIX(1.197448846)) +     /* c5 */
	    MULTIPLY(tmp4 + tmp6, FIX(0.752406978));      /* c9 */
    dataptr[5] = (DCTELEM)
      DESCALE(tmp10 + tmp11 - MULTIPLY(tmp2, FIX(2.373959773)) /* c3+c5-c13 */
	      + MULTIPLY(tmp4, FIX(1.119999435)),         /* c1+c11-c9 */
	      CONST_BITS);
    tmp12 = MULTIPLY(tmp0 + tmp1, FIX(1.334852607)) +     /* c3 */
	    MULTIPLY(tmp5 - tmp6, FIX(0.467085129));      /* c11 */
    dataptr[3] = (DCTELEM)
      DESCALE(tmp10 + tmp12 - MULTIPLY(tmp1, FIX(0.424103948)) /* c3-c9-c13 */
	      - MULTIPLY(tmp5, FIX(3.069855259)),         /* c1+c5+c11 */
	      CONST_BITS);
    dataptr[1] = (DCTELEM)
      DESCALE(tmp11 + tmp12 + tmp3 + tmp6 -
	      MULTIPLY(tmp0 + tmp6, FIX(1.126980169)),    /* c3+c5-c1 */
	      CONST_BITS);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == 14)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We leave the results scaled up by an overall factor of 8.
   * We must also scale the output by (8/14)**2 = 16/49, which we partially
   * fold into the constant multipliers and final shifting:
   * cK now represents sqrt(2) * cos(K*pi/28) * 32/49.
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*5];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] + wsptr[DCTSIZE*3];
    tmp13 = dataptr[DCTSIZE*3] + wsptr[DCTSIZE*2];
    tmp4 = dataptr[DCTSIZE*4] + wsptr[DCTSIZE*1];
    tmp5 = dataptr[DCTSIZE*5] + wsptr[DCTSIZE*0];
    tmp6 = dataptr[DCTSIZE*6] + dataptr[DCTSIZE*7];

    tmp10 = tmp0 + tmp6;
    tmp14 = tmp0 - tmp6;
    tmp11 = tmp1 + tmp5;
    tmp15 = tmp1 - tmp5;
    tmp12 = tmp2 + tmp4;
    tmp16 = tmp2 - tmp4;

    tmp0 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*5];
    tmp1 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] - wsptr[DCTSIZE*3];
    tmp3 = dataptr[DCTSIZE*3] - wsptr[DCTSIZE*2];
    tmp4 = dataptr[DCTSIZE*4] - wsptr[DCTSIZE*1];
    tmp5 = dataptr[DCTSIZE*5] - wsptr[DCTSIZE*0];
    tmp6 = dataptr[DCTSIZE*6] - dataptr[DCTSIZE*7];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp11 + tmp12 + tmp13,
		       FIX(0.653061224)),                 /* 32/49 */
	      CONST_BITS+1);
    tmp13 += tmp13;
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp13, FIX(0.832106052)) + /* c4 */
	      MULTIPLY(tmp11 - tmp13, FIX(0.205513223)) - /* c12 */
	      MULTIPLY(tmp12 - tmp13, FIX(0.575835255)),  /* c8 */
	      CONST_BITS+1);

    tmp10 = MULTIPLY(tmp14 + tmp15, FIX(0.722074570));    /* c6 */

    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp14, FIX(0.178337691))   /* c2-c6 */
	      + MULTIPLY(tmp16, FIX(0.400721155)),        /* c10 */
	      CONST_BITS+1);
    dataptr[DCTSIZE*6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp15, FIX(1.122795725))   /* c6+c10 */
	      - MULTIPLY(tmp16, FIX(0.900412262)),        /* c2 */
	      CONST_BITS+1);

    /* Odd part */

    tmp10 = tmp1 + tmp2;
    tmp11 = tmp5 - tmp4;
    dataptr[DCTSIZE*7] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 - tmp10 + tmp3 - tmp11 - tmp6,
		       FIX(0.653061224)),                 /* 32/49 */
	      CONST_BITS+1);
    tmp3  = MULTIPLY(tmp3 , FIX(0.653061224));            /* 32/49 */
    tmp10 = MULTIPLY(tmp10, - FIX(0.103406812));          /* -c13 */
    tmp11 = MULTIPLY(tmp11, FIX(0.917760839));            /* c1 */
    tmp10 += tmp11 - tmp3;
    tmp11 = MULTIPLY(tmp0 + tmp2, FIX(0.782007410)) +     /* c5 */
	    MULTIPLY(tmp4 + tmp6, FIX(0.491367823));      /* c9 */
    dataptr[DCTSIZE*5] = (DCTELEM)
      DESCALE(tmp10 + tmp11 - MULTIPLY(tmp2, FIX(1.550341076)) /* c3+c5-c13 */
	      + MULTIPLY(tmp4, FIX(0.731428202)),         /* c1+c11-c9 */
	      CONST_BITS+1);
    tmp12 = MULTIPLY(tmp0 + tmp1, FIX(0.871740478)) +     /* c3 */
	    MULTIPLY(tmp5 - tmp6, FIX(0.305035186));      /* c11 */
    dataptr[DCTSIZE*3] = (DCTELEM)
      DESCALE(tmp10 + tmp12 - MULTIPLY(tmp1, FIX(0.276965844)) /* c3-c9-c13 */
	      - MULTIPLY(tmp5, FIX(2.004803435)),         /* c1+c5+c11 */
	      CONST_BITS+1);
    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(tmp11 + tmp12 + tmp3
	      - MULTIPLY(tmp0, FIX(0.735987049))          /* c3+c5-c1 */
	      - MULTIPLY(tmp6, FIX(0.082925825)),         /* c9-c11-c13 */
	      CONST_BITS+1);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}